

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_mristep.c
# Opt level: O0

int MRIStepRootInit(void *arkode_mem,int nrtfn,ARKRootFn g)

{
  undefined4 in_ESI;
  long in_RDI;
  ARKodeMem ark_mem;
  undefined4 in_stack_ffffffffffffffe8;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  int iVar1;
  
  if (in_RDI == 0) {
    arkProcessError((ARKodeMem)0x0,-0x15,"ARKode::MRIStep","MRIStepRootInit",
                    "arkode_mem = NULL illegal.");
    iVar1 = -0x15;
  }
  else {
    iVar1 = arkRootInit((ARKodeMem)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
                        (int)((ulong)in_RDI >> 0x20),
                        (ARKRootFn)CONCAT44(in_ESI,in_stack_ffffffffffffffe8));
  }
  return iVar1;
}

Assistant:

int MRIStepRootInit(void *arkode_mem, int nrtfn, ARKRootFn g)
{
  /* unpack ark_mem, call arkRootInit, and return */
  ARKodeMem ark_mem;
  if (arkode_mem==NULL) {
    arkProcessError(NULL, ARK_MEM_NULL, "ARKode::MRIStep",
                    "MRIStepRootInit", MSG_ARK_NO_MEM);
    return(ARK_MEM_NULL);
  }
  ark_mem = (ARKodeMem) arkode_mem;
  return(arkRootInit(ark_mem, nrtfn, g));
}